

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fCopyImageTests.cpp
# Opt level: O3

void deqp::gles31::Functional::anon_unknown_0::genImage
               (Functions *gl,Random *rng,deUint32 name,
               vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
               *levels,ImageInfo *info,deUint32 moreRestrictiveFormat)

{
  deUint32 dVar1;
  deUint32 target;
  byte bVar2;
  ChannelOrder CVar3;
  ChannelType CVar4;
  bool bVar5;
  int iVar6;
  GLenum GVar7;
  int iVar8;
  TextureChannelClass TVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  deBool dVar13;
  ObjectTraits *traits;
  TextureFormat TVar14;
  ArrayBuffer<unsigned_char,_1UL,_1UL> *pAVar15;
  TransferFormat TVar16;
  TransferFormat TVar17;
  long lVar18;
  size_t __n;
  uint uVar19;
  GLenum *pGVar20;
  long lVar21;
  GLint GVar22;
  char *pcVar23;
  void *pvVar24;
  ulong uVar25;
  int iVar26;
  TextureFormat format;
  IVec4 color;
  vector<unsigned_char,_std::allocator<unsigned_char>_> texelBlock;
  GLfloat local_c8;
  GLfloat GStack_c4;
  GLfloat GStack_c0;
  GLfloat GStack_bc;
  Framebuffer framebuffer;
  ConstPixelBufferAccess texelAccess;
  PixelBufferAccess refAccess;
  
  if (info->m_target != 0x8d41) {
    iVar8 = getTexelBlockSize(info->m_format);
    getTexelBlockPixelSize((anon_unknown_0 *)&refAccess,info->m_format);
    iVar10 = getLevelCount(info);
    std::
    vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
    ::resize(levels,(long)iVar10);
    (*gl->pixelStorei)(0xcf5,1);
    GVar7 = (*gl->getError)();
    glu::checkError(GVar7,"Setting pixel store aligment failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fCopyImageTests.cpp"
                    ,0x33c);
    (*gl->bindTexture)(info->m_target,name);
    GVar7 = (*gl->getError)();
    glu::checkError(GVar7,"Binding texture failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fCopyImageTests.cpp"
                    ,0x33f);
    iVar10 = getLevelCount(info);
    if (0 < iVar10) {
      lVar21 = 0;
      do {
        pAVar15 = (levels->
                  super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                  )._M_impl.super__Vector_impl_data._M_start + lVar21;
        dVar1 = info->m_target;
        texelAccess.m_size.m_data[0] = 0;
        texelAccess.m_format.order = R;
        texelAccess.m_format.type = SNORM_INT8;
        bVar2 = (byte)lVar21;
        if (dVar1 == 0x8c1a) {
          texelAccess.m_format.order = (info->m_size).m_data[0] >> (bVar2 & 0x1f);
          if ((int)texelAccess.m_format.order < 2) {
            texelAccess.m_format.order = A;
          }
          texelAccess.m_format.type = (info->m_size).m_data[1] >> (bVar2 & 0x1f);
          if ((int)texelAccess.m_format.type < 2) {
            texelAccess.m_format.type = SNORM_INT16;
          }
          texelAccess.m_size.m_data[0] = (info->m_size).m_data[2];
        }
        else {
          lVar18 = 0;
          do {
            iVar10 = (info->m_size).m_data[lVar18] >> (bVar2 & 0x1f);
            if (iVar10 < 2) {
              iVar10 = 1;
            }
            texelAccess.m_size.m_data[lVar18 + -2] = iVar10;
            lVar18 = lVar18 + 1;
          } while (lVar18 != 3);
        }
        uVar19 = (uint)(dVar1 == 0x8513) * 5 + 1;
        framebuffer.super_ObjectWrapper.m_traits._0_4_ = 0;
        framebuffer.super_ObjectWrapper.m_gl = (Functions *)0x0;
        lVar18 = 0;
        do {
          iVar10 = texelAccess.m_size.m_data[lVar18 + -2];
          iVar6 = refAccess.super_ConstPixelBufferAccess.m_size.m_data[lVar18 + -2];
          *(uint *)((long)&framebuffer.super_ObjectWrapper.m_gl + lVar18 * 4) =
               (iVar10 / iVar6 + 1) - (uint)(iVar10 % iVar6 == 0);
          lVar18 = lVar18 + 1;
        } while (lVar18 != 3);
        iVar6 = framebuffer.super_ObjectWrapper.m_gl._4_4_ *
                (int)framebuffer.super_ObjectWrapper.m_gl *
                (int)framebuffer.super_ObjectWrapper.m_traits;
        iVar11 = iVar6 * iVar8;
        de::ArrayBuffer<unsigned_char,_1UL,_1UL>::setStorage(pAVar15,(long)(int)(iVar11 * uVar19));
        iVar10 = texelAccess.m_size.m_data[0];
        CVar3 = texelAccess.m_format.order;
        CVar4 = texelAccess.m_format.type;
        uVar25 = (ulong)uVar19;
        iVar26 = 0;
        pGVar20 = &DAT_01c92610;
        do {
          genTexel(rng,moreRestrictiveFormat,iVar8,iVar6,
                   (deUint8 *)((long)pAVar15->m_ptr + (long)iVar26));
          dVar1 = info->m_format;
          target = info->m_target;
          pvVar24 = (void *)((long)iVar26 + (long)pAVar15->m_ptr);
          GVar7 = target;
          if (target == 0x8513) {
            GVar7 = *pGVar20;
          }
          bVar5 = glu::isCompressedFormat(dVar1);
          GVar22 = (GLint)lVar21;
          if (bVar5) {
            iVar12 = getTargetTexDims(target);
            if (iVar12 == 3) {
              (*gl->compressedTexImage3D)(GVar7,GVar22,dVar1,CVar3,CVar4,iVar10,0,iVar11,pvVar24);
              GVar7 = (*gl->getError)();
              pcVar23 = "glCompressedTexImage3D failed.";
              iVar12 = 0x310;
LAB_0166444e:
              glu::checkError(GVar7,pcVar23,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fCopyImageTests.cpp"
                              ,iVar12);
            }
            else if (iVar12 == 2) {
              (*gl->compressedTexImage2D)(GVar7,GVar22,dVar1,CVar3,CVar4,0,iVar11,pvVar24);
              GVar7 = (*gl->getError)();
              pcVar23 = "glCompressedTexImage2D failed.";
              iVar12 = 0x30b;
LAB_016643a0:
              glu::checkError(GVar7,pcVar23,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fCopyImageTests.cpp"
                              ,iVar12);
            }
          }
          else {
            TVar14 = glu::mapGLInternalFormat(dVar1);
            TVar16 = glu::getTransferFormat(TVar14);
            TVar14 = glu::mapGLInternalFormat(dVar1);
            TVar17 = glu::getTransferFormat(TVar14);
            iVar12 = getTargetTexDims(target);
            if (iVar12 == 3) {
              (*gl->texImage3D)(GVar7,GVar22,dVar1,CVar3,CVar4,iVar10,0,TVar16.format,
                                TVar17.dataType,pvVar24);
              GVar7 = (*gl->getError)();
              pcVar23 = "glTexImage3D failed.";
              iVar12 = 0x326;
              goto LAB_0166444e;
            }
            if (iVar12 == 2) {
              (*gl->texImage2D)(GVar7,GVar22,dVar1,CVar3,CVar4,0,TVar16.format,TVar17.dataType,
                                pvVar24);
              GVar7 = (*gl->getError)();
              pcVar23 = "glTexImage2D failed.";
              iVar12 = 0x321;
              goto LAB_016643a0;
            }
          }
          pGVar20 = pGVar20 + 1;
          iVar26 = iVar26 + iVar11;
          uVar25 = uVar25 - 1;
        } while (uVar25 != 0);
        lVar21 = lVar21 + 1;
        iVar10 = getLevelCount(info);
      } while (lVar21 < iVar10);
    }
    (*gl->texParameteri)(info->m_target,0x2802,0x812f);
    (*gl->texParameteri)(info->m_target,0x2803,0x812f);
    GVar7 = info->m_target;
    if (GVar7 == 0x806f) {
      (*gl->texParameteri)(0x806f,0x8072,0x812f);
      GVar7 = info->m_target;
    }
    (*gl->texParameteri)(GVar7,0x2801,0x2600);
    (*gl->texParameteri)(info->m_target,0x2800,0x2600);
    GVar7 = (*gl->getError)();
    glu::checkError(GVar7,"Setting texture parameters failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fCopyImageTests.cpp"
                    ,0x35e);
    (*gl->bindTexture)(info->m_target,0);
    GVar7 = (*gl->getError)();
    glu::checkError(GVar7,"Unbinding texture failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fCopyImageTests.cpp"
                    ,0x361);
    return;
  }
  iVar8 = (info->m_size).m_data[0];
  iVar10 = (info->m_size).m_data[1];
  format = glu::mapGLInternalFormat(info->m_format);
  traits = glu::objectTraits(OBJECTTYPE_FRAMEBUFFER);
  glu::ObjectWrapper::ObjectWrapper(&framebuffer.super_ObjectWrapper,gl,traits);
  std::
  vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
  ::resize(levels,1);
  pAVar15 = (levels->
            super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  iVar6 = tcu::TextureFormat::getPixelSize(&format);
  de::ArrayBuffer<unsigned_char,_1UL,_1UL>::setStorage(pAVar15,(long)(iVar10 * iVar8 * iVar6));
  tcu::PixelBufferAccess::PixelBufferAccess
            (&refAccess,&format,iVar8,iVar10,1,
             ((levels->
              super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
              )._M_impl.super__Vector_impl_data._M_start)->m_ptr);
  (*gl->bindRenderbuffer)(0x8d41,name);
  (*gl->renderbufferStorage)
            (0x8d41,info->m_format,(info->m_size).m_data[0],(info->m_size).m_data[1]);
  GVar7 = (*gl->getError)();
  glu::checkError(GVar7,"Binding and setting storage for renderbuffer failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fCopyImageTests.cpp"
                  ,0x37b);
  (*gl->bindFramebuffer)(0x8d40,framebuffer.super_ObjectWrapper.m_object);
  (*gl->framebufferRenderbuffer)(0x8d40,0x8ce0,0x8d41,name);
  GVar7 = (*gl->getError)();
  glu::checkError(GVar7,"Binding framebuffer and attaching renderbuffer failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fCopyImageTests.cpp"
                  ,0x37f);
  iVar8 = tcu::TextureFormat::getPixelSize(&format);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&texelBlock,(long)iVar8,(allocator_type *)&texelAccess);
  dVar1 = info->m_format;
  bVar5 = glu::isCompressedFormat(dVar1);
  if (!bVar5) {
    TVar14 = glu::mapGLInternalFormat(dVar1);
    TVar9 = tcu::getTextureChannelClass(TVar14.type);
    if (TVar9 < TEXTURECHANNELCLASS_SIGNED_INTEGER) {
      bVar5 = isFloatFormat(moreRestrictiveFormat);
      if (bVar5) {
        __n = (long)texelBlock.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)texelBlock.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start;
        iVar8 = 0;
      }
      else {
        dVar13 = deRandom_getBool(&rng->m_rnd);
        __n = (long)texelBlock.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)texelBlock.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start;
        iVar8 = -(uint)(dVar13 == 1);
      }
      memset(texelBlock.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,iVar8,__n);
      goto LAB_016645b5;
    }
  }
  iVar8 = tcu::TextureFormat::getPixelSize(&format);
  genTexel(rng,moreRestrictiveFormat,iVar8,1,
           texelBlock.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start);
LAB_016645b5:
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            (&texelAccess,&format,1,1,1,
             texelBlock.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start);
  bVar5 = isIntFormat(info->m_format);
  if (bVar5) {
    tcu::ConstPixelBufferAccess::getPixelInt((ConstPixelBufferAccess *)&color,(int)&texelAccess,0,0)
    ;
    (*gl->clearBufferiv)(0x1800,0,color.m_data);
    GVar7 = (*gl->getError)();
    glu::checkError(GVar7,"Failed to clear renderbuffer.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fCopyImageTests.cpp"
                    ,0x39c);
    tcu::clear(&refAccess,&color);
  }
  else {
    bVar5 = isUintFormat(info->m_format);
    if (bVar5) {
      tcu::ConstPixelBufferAccess::getPixelInt
                ((ConstPixelBufferAccess *)&color,(int)&texelAccess,0,0);
      (*gl->clearBufferuiv)(0x1800,0,(GLuint *)&color);
      GVar7 = (*gl->getError)();
      glu::checkError(GVar7,"Failed to clear renderbuffer.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fCopyImageTests.cpp"
                      ,0x3a6);
      tcu::clear(&refAccess,&color);
    }
    else {
      tcu::ConstPixelBufferAccess::getPixel((ConstPixelBufferAccess *)&color,(int)&texelAccess,0,0);
      bVar5 = tcu::isSRGB(format);
      if (bVar5) {
        tcu::sRGBToLinear((tcu *)&local_c8,(Vec4 *)&color);
      }
      else {
        local_c8 = (GLfloat)color.m_data[0];
        GStack_c4 = (GLfloat)color.m_data[1];
        GStack_c0 = (GLfloat)color.m_data[2];
        GStack_bc = (GLfloat)color.m_data[3];
      }
      bVar5 = isFloatFormat(info->m_format);
      if (bVar5) {
        (*gl->clearBufferfv)(0x1800,0,&local_c8);
      }
      else {
        (*gl->clearColor)(local_c8,GStack_c4,GStack_c0,GStack_bc);
        (*gl->clear)(0x4000);
      }
      GVar7 = (*gl->getError)();
      glu::checkError(GVar7,"Failed to clear renderbuffer.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fCopyImageTests.cpp"
                      ,0x3bf);
      tcu::clear(&refAccess,(Vec4 *)&color);
    }
  }
  if (texelBlock.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(texelBlock.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)texelBlock.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)texelBlock.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  (*gl->bindRenderbuffer)(0x8d41,0);
  (*gl->bindFramebuffer)(0x8d40,0);
  GVar7 = (*gl->getError)();
  glu::checkError(GVar7,"Failed to unbind renderbufer and framebuffer.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fCopyImageTests.cpp"
                  ,0x3c8);
  glu::ObjectWrapper::~ObjectWrapper(&framebuffer.super_ObjectWrapper);
  return;
}

Assistant:

void genImage (const glw::Functions&			gl,
			   de::Random&						rng,
			   deUint32							name,
			   vector<ArrayBuffer<deUint8> >&	levels,
			   const ImageInfo&					info,
			   deUint32							moreRestrictiveFormat)
{
	if (isTextureTarget(info.getTarget()))
		genTextureImage(gl, rng, name, levels, info, moreRestrictiveFormat);
	else
		genRenderbufferImage(gl, rng, name, levels, info, moreRestrictiveFormat);
}